

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

bool __thiscall SceneRender::loadScene(SceneRender *this,Uniforms *_uniforms)

{
  Model *this_00;
  SceneRender *pSVar1;
  _Base_ptr p_Var2;
  mapped_type *ppLVar3;
  DefaultShaders _type;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  float fVar4;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  float local_5c;
  Uniforms *local_58;
  SceneRender *local_50;
  BoundingBox local_48;
  
  local_50 = this;
  vera::cleanLabels();
  local_48.min.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x7f7fffff;
  local_48.min.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x7f7fffff;
  local_48.min.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x7f7fffff;
  local_48.max.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x800000;
  local_48.max.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x800000;
  local_48.max.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x800000;
  local_58 = _uniforms;
  for (p_Var2 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var2 !=
        &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    vera::addLabel(&(*(Model **)(p_Var2 + 2))->m_name,*(Model **)(p_Var2 + 2),LABEL_RIGHT,0.0);
    vera::BoundingBox::expand(&local_48,(BoundingBox *)(*(long *)(p_Var2 + 2) + 0x298));
  }
  local_5c = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_48.min);
  fVar4 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_48.max);
  pSVar1 = local_50;
  if (fVar4 <= local_5c) {
    fVar4 = local_5c;
  }
  if (fVar4 <= 0.5) {
    fVar4 = 0.5;
  }
  local_50->m_area = fVar4;
  local_50->m_floor_height = (float)local_48.min.field_1;
  std::__cxx11::string::string((string *)&local_80,"FLOOR",&local_a1);
  std::__cxx11::string::string((string *)&local_a0,"",&local_a2);
  this_00 = &pSVar1->m_floor;
  vera::Model::addDefine(this_00,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"MODEL_VERTEX_COLOR",&local_a1);
  std::__cxx11::string::string((string *)&local_a0,"v_color",&local_a2);
  vera::Model::addDefine(this_00,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"MODEL_VERTEX_NORMAL",&local_a1);
  std::__cxx11::string::string((string *)&local_a0,"v_normal",&local_a2);
  vera::Model::addDefine(this_00,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"MODEL_VERTEX_TEXCOORD",&local_a1);
  std::__cxx11::string::string((string *)&local_a0,"v_texcoord",&local_a2);
  vera::Model::addDefine(this_00,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  vera::getDefaultSrc_abi_cxx11_(&local_80,(vera *)0x9,_type);
  vera::getDefaultSrc_abi_cxx11_(&local_a0,(vera *)0x8,_type_00);
  vera::Shader::setSource(&pSVar1->m_cubemap_shader,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"u_light",&local_a1);
  std::__cxx11::string::string((string *)&local_a0,"default",&local_a2);
  ppLVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
            ::operator[](&(local_58->super_Scene).lights,&local_a0);
  vera::addLabel(&local_80,&(*ppLVar3)->super_Node,LABEL_DOWN,30.0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  vera::getDefaultSrc_abi_cxx11_(&local_80,(vera *)0xd,_type_01);
  vera::getDefaultSrc_abi_cxx11_(&local_a0,(vera *)0xc,_type_02);
  vera::Shader::setSource(&pSVar1->m_lightUI_shader,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return true;
}

Assistant:

bool SceneRender::loadScene(Uniforms& _uniforms) {
    vera::cleanLabels();

    // Calculate the total area
    vera::BoundingBox bbox;
    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        vera::addLabel( it->second->getName(), it->second, vera::LABEL_RIGHT);
        bbox.expand( it->second->getBoundingBox() );
    }

    m_area = glm::max(0.5f, glm::max(glm::length(bbox.min), glm::length(bbox.max)));
    
    // Floor
    m_floor_height = bbox.min.y;
    m_floor.addDefine("FLOOR");
    m_floor.addDefine("MODEL_VERTEX_COLOR", "v_color");
    m_floor.addDefine("MODEL_VERTEX_NORMAL", "v_normal");
    m_floor.addDefine("MODEL_VERTEX_TEXCOORD","v_texcoord");
    // m_floor.setShader(vera::getDefaultSrc(vera::FRAG_DEFAULT_SCENE), vera::getDefaultSrc(vera::VERT_DEFAULT_SCENE));

    // Cubemap
    m_cubemap_shader.setSource(vera::getDefaultSrc(vera::FRAG_CUBEMAP), vera::getDefaultSrc(vera::VERT_CUBEMAP));

    // Light
    vera::addLabel("u_light", _uniforms.lights["default"], vera::LABEL_DOWN, 30.0f);
    m_lightUI_shader.setSource(vera::getDefaultSrc(vera::FRAG_LIGHT), vera::getDefaultSrc(vera::VERT_LIGHT));

    return true;
}